

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_intrabc_hash_search
              (AV1_COMP *cpi,MACROBLOCKD *xd,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
              IntraBCHashInfo *intrabc_hash_info,FULLPEL_MV *best_mv)

{
  BLOCK_SIZE BVar1;
  uint uVar2;
  buf_2d *pbVar3;
  SequenceHeader *pSVar4;
  FULLPEL_MV mv;
  int32_t iVar5;
  int iVar6;
  ushort *puVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  FULLPEL_MV hash_mv;
  uint32_t hash_value1;
  ulong local_a8;
  hash_table *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  uint32_t hash_value2;
  FULLPEL_MOTION_SEARCH_PARAMS *local_80;
  ulong local_78;
  ulong local_70;
  FullMvLimits *local_68;
  FULLPEL_MV *local_60;
  long local_58;
  Iterator iterator;
  FULLPEL_MV_STATS mv_stats;
  
  iVar13 = 0x7fffffff;
  if ((((cpi->common).features.allow_screen_content_tools == true) &&
      ((cpi->common).features.allow_intrabc == true)) &&
     (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
    BVar1 = ms_params->bsize;
    bVar8 = block_size_wide[BVar1];
    if (bVar8 == block_size_high[BVar1]) {
      pbVar3 = (ms_params->ms_buffers).src;
      local_a8 = (ulong)(uint)xd->mi_row;
      iVar14 = xd->mi_col;
      local_80 = ms_params;
      local_60 = best_mv;
      av1_get_block_hash_value
                (intrabc_hash_info,pbVar3->buf,pbVar3->stride,(uint)bVar8,&hash_value1,&hash_value2,
                 (uint)xd->cur_buf->flags >> 3 & 1);
      local_a0 = &intrabc_hash_info->intrabc_hash_table;
      iVar5 = av1_hash_table_count(&intrabc_hash_info->intrabc_hash_table,hash_value1);
      iVar13 = 0x7fffffff;
      if (1 < iVar5) {
        local_68 = &local_80->mv_limits;
        local_8c = iVar14 * 4;
        local_88 = (int)local_a8 * 4;
        iterator = av1_hash_get_first_iterator(local_a0,hash_value1);
        local_a0 = (hash_table *)CONCAT44(local_a0._4_4_,(int)local_a8 << 5);
        local_70 = 0x10003L >> (BVar1 & 0x3f);
        local_78 = 0x20005L >> (BVar1 & 0x3f);
        local_90 = iVar14 << 5;
        local_58 = (ulong)bVar8 << 3;
        iVar14 = (iVar14 >> 4) + -4;
        iVar13 = 0x7fffffff;
        while (bVar15 = iVar5 != 0, iVar5 = iVar5 + -1, bVar15) {
          puVar7 = (ushort *)aom_iterator_get(&iterator);
          if (hash_value2 == *(uint32_t *)(puVar7 + 2)) {
            iVar9 = ((int)(((uint)puVar7[1] - local_88) * 0x80000) >> 0x10) + (int)local_a0;
            iVar12 = (xd->tile).mi_row_start * 0x20;
            if (iVar12 <= iVar9) {
              iVar10 = ((int)(((uint)*puVar7 - local_8c) * 0x80000) >> 0x10) + local_90;
              uVar2 = (xd->tile).mi_col_start;
              iVar11 = uVar2 * 0x20;
              if (iVar11 <= iVar10) {
                iVar6 = iVar9 + (int)local_58;
                if (iVar6 <= (xd->tile).mi_row_end * 0x20) {
                  local_94 = (int)local_58 + iVar10;
                  local_98 = (xd->tile).mi_col_end;
                  if (local_94 <= local_98 * 0x20) {
                    pSVar4 = (cpi->common).seq_params;
                    if (((xd->is_chroma_ref != true) || (pSVar4->monochrome != '\0')) ||
                       ((((local_70 & 1) == 0 ||
                         ((xd->plane[1].subsampling_x == 0 || (iVar11 + 0x20 <= iVar10)))) &&
                        (((local_78 & 1) == 0 ||
                         ((xd->plane[1].subsampling_y == 0 || (iVar12 + 0x20 <= iVar9)))))))) {
                      bVar8 = (byte)pSVar4->mib_size_log2;
                      iVar12 = (int)local_a8 >> (bVar8 & 0x1f);
                      iVar10 = 4 << (bVar8 & 0x1f);
                      iVar9 = ((iVar6 >> 3) + -1) / iVar10;
                      if ((iVar9 <= iVar12) &&
                         ((iVar11 = (local_94 >> 3) + -1 >> 6,
                          iVar6 = ((int)(local_98 + ~uVar2) >> 4) + 1,
                          iVar9 * iVar6 + iVar11 < iVar12 * iVar6 + iVar14 &&
                          (iVar11 < (int)((iVar12 - iVar9) * ((0x40 < iVar10) + 5) + iVar14))))) {
                        mv.col = (int16_t)((uint)*puVar7 - local_8c);
                        mv.row = (int16_t)((uint)puVar7[1] - local_88);
                        hash_mv = mv;
                        iVar9 = av1_is_fullmv_in_range(local_68,mv);
                        if ((iVar9 != 0) &&
                           (iVar9 = get_mvpred_var_cost(local_80,&hash_mv,&mv_stats), iVar9 < iVar13
                           )) {
                          *local_60 = mv;
                          iVar13 = iVar9;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          aom_iterator_increment(&iterator);
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int av1_intrabc_hash_search(const AV1_COMP *cpi, const MACROBLOCKD *xd,
                            const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                            IntraBCHashInfo *intrabc_hash_info,
                            FULLPEL_MV *best_mv) {
  if (!av1_use_hash_me(cpi)) return INT_MAX;

  const BLOCK_SIZE bsize = ms_params->bsize;
  const int block_width = block_size_wide[bsize];
  const int block_height = block_size_high[bsize];

  if (block_width != block_height) return INT_MAX;

  const FullMvLimits *mv_limits = &ms_params->mv_limits;
  const MSBuffers *ms_buffer = &ms_params->ms_buffers;

  const uint8_t *src = ms_buffer->src->buf;
  const int src_stride = ms_buffer->src->stride;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int x_pos = mi_col * MI_SIZE;
  const int y_pos = mi_row * MI_SIZE;

  uint32_t hash_value1, hash_value2;
  int best_hash_cost = INT_MAX;

  // for the hashMap
  hash_table *ref_frame_hash = &intrabc_hash_info->intrabc_hash_table;

  av1_get_block_hash_value(intrabc_hash_info, src, src_stride, block_width,
                           &hash_value1, &hash_value2, is_cur_buf_hbd(xd));

  const int count = av1_hash_table_count(ref_frame_hash, hash_value1);
  if (count <= 1) {
    return INT_MAX;
  }

  Iterator iterator = av1_hash_get_first_iterator(ref_frame_hash, hash_value1);
  for (int i = 0; i < count; i++, aom_iterator_increment(&iterator)) {
    block_hash ref_block_hash = *(block_hash *)(aom_iterator_get(&iterator));
    if (hash_value2 == ref_block_hash.hash_value2) {
      // Make sure the prediction is from valid area.
      const MV dv = { GET_MV_SUBPEL(ref_block_hash.y - y_pos),
                      GET_MV_SUBPEL(ref_block_hash.x - x_pos) };
      if (!av1_is_dv_valid(dv, &cpi->common, xd, mi_row, mi_col, bsize,
                           cpi->common.seq_params->mib_size_log2))
        continue;

      FULLPEL_MV hash_mv;
      hash_mv.col = ref_block_hash.x - x_pos;
      hash_mv.row = ref_block_hash.y - y_pos;
      if (!av1_is_fullmv_in_range(mv_limits, hash_mv)) continue;
      FULLPEL_MV_STATS mv_stats;
      const int refCost = get_mvpred_var_cost(ms_params, &hash_mv, &mv_stats);
      if (refCost < best_hash_cost) {
        best_hash_cost = refCost;
        *best_mv = hash_mv;
      }
    }
  }

  return best_hash_cost;
}